

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

int Gia_ManDupDemiterFindMin(Vec_Wec_t *vSupps,Vec_Int_t *vTakenIns,Vec_Int_t *vTakenOuts)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  if ((long)vSupps->nSize < 1) {
    iVar7 = -1;
  }
  else {
    uVar5 = 0;
    uVar4 = (ulong)(uint)vTakenOuts->nSize;
    if (vTakenOuts->nSize < 1) {
      uVar4 = uVar5;
    }
    uVar2 = 0xffffffff;
    iVar6 = 1000000000;
    do {
      if (uVar5 == uVar4) {
LAB_001f4543:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vTakenOuts->pArray[uVar5] == 0) {
        lVar3 = (long)vSupps->pArray[uVar5].nSize;
        if (lVar3 < 1) {
          iVar7 = 0;
        }
        else {
          lVar8 = 0;
          iVar7 = 0;
          do {
            iVar1 = vSupps->pArray[uVar5].pArray[lVar8];
            if (((long)iVar1 < 0) || (vTakenIns->nSize <= iVar1)) goto LAB_001f4543;
            iVar7 = iVar7 + (uint)(vTakenIns->pArray[iVar1] == 0);
            lVar8 = lVar8 + 1;
          } while (lVar3 != lVar8);
        }
        if (iVar7 < iVar6) {
          uVar2 = uVar5 & 0xffffffff;
        }
        if (iVar7 <= iVar6) {
          iVar6 = iVar7;
        }
      }
      iVar7 = (int)uVar2;
      uVar5 = uVar5 + 1;
    } while (uVar5 != (long)vSupps->nSize);
  }
  return iVar7;
}

Assistant:

int Gia_ManDupDemiterFindMin( Vec_Wec_t * vSupps, Vec_Int_t * vTakenIns, Vec_Int_t * vTakenOuts )
{
    Vec_Int_t * vLevel;
    int i, k, iObj, iObjBest = -1;
    int Count, CountBest = ABC_INFINITY;
    Vec_WecForEachLevel( vSupps, vLevel, i )
    {
        if ( Vec_IntEntry(vTakenOuts, i) )
            continue;
        Count = 0;
        Vec_IntForEachEntry( vLevel, iObj, k )
            Count += !Vec_IntEntry(vTakenIns, iObj);
        if ( CountBest > Count )
        {
            CountBest = Count;
            iObjBest = i;
        }
    }
    return iObjBest;
}